

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibrary.cpp
# Opt level: O0

vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> * __thiscall
deqp::gls::ShaderLibrary::loadShaderFile
          (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *__return_storage_ptr__,
          ShaderLibrary *this,char *fileName)

{
  ContextInfo *__s;
  Archive *archive;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  CaseFactory caseFactory;
  char *fileName_local;
  ShaderLibrary *this_local;
  
  caseFactory.m_contextInfo = (ContextInfo *)fileName;
  anon_unknown_1::CaseFactory::CaseFactory
            ((CaseFactory *)local_40,this->m_testCtx,this->m_renderCtx,this->m_contextInfo);
  archive = tcu::TestContext::getArchive(this->m_testCtx);
  __s = caseFactory.m_contextInfo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,(char *)__s,&local_61);
  glu::sl::parseFile(__return_storage_ptr__,archive,&local_60,(ShaderCaseFactory *)local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::TestNode*> ShaderLibrary::loadShaderFile (const char* fileName)
{
	CaseFactory	caseFactory	(m_testCtx, m_renderCtx, m_contextInfo);

	return glu::sl::parseFile(m_testCtx.getArchive(), fileName, &caseFactory);
}